

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fourier_transforms.cc
# Opt level: O0

void recursive_fft(Complex *input,int size)

{
  long lVar1;
  float r;
  uint size_00;
  Complex *pCVar2;
  Complex *pCVar3;
  double dVar4;
  Complex aCStack_e0 [2];
  float local_cc;
  float local_c8;
  float local_c4;
  ulong local_c0;
  Complex *local_b8;
  Complex *local_b0;
  Complex *local_a8;
  ulong local_a0;
  Complex *local_98;
  Complex *local_90;
  Complex *local_88;
  Complex *local_80;
  ulong local_78;
  Complex *local_70;
  Complex local_64;
  Complex local_5c;
  Complex local_54;
  Complex local_4c;
  Complex temp;
  float theta;
  size_t i;
  size_t k;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int size_local;
  Complex *input_local;
  
  if (1 < size) {
    size_00 = size >> 1;
    local_78 = (ulong)size_00;
    lVar1 = -(local_78 * 8 + 0xf & 0xfffffffffffffff0);
    pCVar2 = (Complex *)((long)aCStack_e0 + lVar1 + 8);
    local_70 = pCVar2;
    if (local_78 != 0) {
      local_88 = pCVar2 + local_78;
      local_80 = pCVar2;
      do {
        pCVar3 = local_80;
        local_90 = local_80;
        *(undefined8 *)((long)aCStack_e0 + lVar1) = 0x103c3a;
        Complex::Complex(pCVar3);
        local_80 = local_90 + 1;
      } while (local_80 != local_88);
    }
    local_a0 = (ulong)size_00;
    pCVar2 = (Complex *)((long)pCVar2 - (local_a0 * 8 + 0xf & 0xfffffffffffffff0));
    local_98 = pCVar2;
    if (local_a0 != 0) {
      local_b0 = pCVar2 + local_a0;
      local_a8 = pCVar2;
      do {
        pCVar3 = local_a8;
        local_b8 = local_a8;
        pCVar2[-1].real = 1.491157e-39;
        pCVar2[-1].imag = 0.0;
        Complex::Complex(pCVar3);
        local_a8 = local_b8 + 1;
      } while (local_a8 != local_b0);
    }
    pCVar3 = local_70;
    for (i = 0; i < (ulong)(long)(int)size_00; i = i + 1) {
      local_70[i] = input[i * 2];
      local_98[i] = input[i * 2 + 1];
    }
    pCVar2[-1].real = 1.491354e-39;
    pCVar2[-1].imag = 0.0;
    recursive_fft(pCVar3,size_00);
    pCVar3 = local_98;
    pCVar2[-1].real = 1.491378e-39;
    pCVar2[-1].imag = 0.0;
    recursive_fft(pCVar3,size_00);
    for (stack0xffffffffffffffc0 = 0; local_c0 = stack0xffffffffffffffc0,
        stack0xffffffffffffffc0 < (ulong)(long)(size / 2);
        register0x00000000 = stack0xffffffffffffffc0 + 1) {
      local_c8 = (float)(long)stack0xffffffffffffffc0;
      local_c4 = (float)stack0xffffffffffffffc0;
      temp.real = (local_c4 * -6.2831855) / (float)size;
      dVar4 = (double)temp.real;
      pCVar2[-1].real = 1.491614e-39;
      pCVar2[-1].imag = 0.0;
      dVar4 = cos(dVar4);
      local_cc = (float)dVar4;
      dVar4 = (double)temp.real;
      pCVar2[-1].real = 1.49165e-39;
      pCVar2[-1].imag = 0.0;
      dVar4 = sin(dVar4);
      r = local_cc;
      pCVar2[-1].real = 1.491684e-39;
      pCVar2[-1].imag = 0.0;
      Complex::Complex(&local_54,r,(float)dVar4);
      pCVar2[-1].real = 1.491727e-39;
      pCVar2[-1].imag = 0.0;
      Complex::operator*(&local_4c,&local_54);
      pCVar3 = local_70 + stack0xffffffffffffffc0;
      pCVar2[-1].real = 1.491766e-39;
      pCVar2[-1].imag = 0.0;
      Complex::operator+(&local_5c,pCVar3);
      input[stack0xffffffffffffffc0] = local_5c;
      pCVar3 = local_70 + stack0xffffffffffffffc0;
      pCVar2[-1].real = 1.491828e-39;
      pCVar2[-1].imag = 0.0;
      Complex::operator-(&local_64,pCVar3);
      input[stack0xffffffffffffffc0 + (long)(int)size_00] = local_64;
    }
  }
  return;
}

Assistant:

void recursive_fft(Complex *input, int size) {
    if (size <= 1) {
        return;
    }

    //divide
    Complex even[size >> 1];
    Complex odd[size >> 1];
    for (size_t k = 0; k < (size >> 1); ++k) {
	    even[k] = input[k << 1];
	    odd[k] = input[(k << 1) + 1];
    }

    //recursive call
    recursive_fft(even, size >> 1);
    recursive_fft(odd, size >> 1);

    //combine
    for (size_t i = 0; i < size / 2; ++i) {
        float theta = -2 * PI * i / size;
        Complex temp = Complex(cos(theta), sin(theta)) * odd[i];
        input[i] = even[i] + temp;
        input[i + (size >> 1)] = even[i] - temp;
    }
}